

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

DrawStyle * __thiscall
CMU462::DynamicScene::Mesh::get_draw_style(Mesh *this,HalfedgeElement *element)

{
  HalfedgeElement *element_local;
  Mesh *this_local;
  
  if (((this->super_SceneObject).scene == (Scene *)0x0) ||
     (element != (((this->super_SceneObject).scene)->selected).element)) {
    if (((this->super_SceneObject).scene == (Scene *)0x0) ||
       (element != (((this->super_SceneObject).scene)->hovered).element)) {
      this_local = (Mesh *)this->defaultStyle;
    }
    else {
      this_local = (Mesh *)this->hoveredStyle;
    }
  }
  else {
    this_local = (Mesh *)this->selectedStyle;
  }
  return (DrawStyle *)this_local;
}

Assistant:

DrawStyle *Mesh::get_draw_style( const HalfedgeElement *element ) const
{
   if( scene && element == scene->selected.element )
   {
      return selectedStyle;
   }

   if( scene && element == scene->hovered.element )
   {
      return hoveredStyle;
   }

   return defaultStyle;
}